

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorRotationDriveline.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkMotorRotationDriveline::ArchiveIN
          (ChLinkMotorRotationDriveline *this,ChArchiveIn *marchive)

{
  ChNameValue<std::shared_ptr<chrono::ChShaftsBody>_> local_78;
  ChNameValue<std::shared_ptr<chrono::ChShaftsBody>_> local_60;
  ChNameValue<std::shared_ptr<chrono::ChShaft>_> local_48;
  ChNameValue<std::shared_ptr<chrono::ChShaft>_> local_30;
  
  ChArchiveIn::VersionRead<chrono::ChLinkMotorRotationDriveline>(marchive);
  ChLinkMotorRotation::ArchiveIN(&this->super_ChLinkMotorRotation,marchive);
  local_30._value = (shared_ptr<chrono::ChShaft> *)&(this->super_ChLinkMotorRotation).field_0x278;
  local_30._name = "innershaft1";
  local_30._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_30);
  local_48._value = &this->innershaft2;
  local_48._name = "innershaft2";
  local_48._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_48);
  local_60._value = &this->innerconstraint1;
  local_60._name = "innerconstraint1";
  local_60._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_60);
  local_78._value = &this->innerconstraint2;
  local_78._name = "innerconstraint2";
  local_78._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_78);
  return;
}

Assistant:

void ChLinkMotorRotationDriveline::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChLinkMotorRotationDriveline>();

    // deserialize parent class
    ChLinkMotorRotation::ArchiveIN(marchive);

    // deserialize all member data:
    marchive >> CHNVP(innershaft1);
    marchive >> CHNVP(innershaft2);
    marchive >> CHNVP(innerconstraint1);
    marchive >> CHNVP(innerconstraint2);
}